

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bios.h
# Opt level: O2

int bios_u16(envy_bios *bios,uint offs,uint16_t *res)

{
  if (offs + 1 < bios->length) {
    *res = CONCAT11(bios->data[offs + 1],bios->data[offs]);
    return 0;
  }
  *res = 0;
  fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)offs);
  return -0xe;
}

Assistant:

static inline int bios_u16(struct envy_bios *bios, unsigned int offs, uint16_t *res) {
	if (offs+1 >= bios->length) {
		*res = 0;
		ENVY_BIOS_ERR("requested OOB u16 at 0x%04x\n", offs);
		return -EFAULT;
	}
	*res = bios->data[offs] | bios->data[offs+1] << 8;
	return 0;
}